

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_IntInsert(Vec_Int_t *vProd,Vec_Int_t *vLevel,int Node,int Level)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = vLevel->nSize;
  uVar6 = uVar1 + 1;
  uVar5 = (ulong)uVar1;
  do {
    uVar7 = (int)uVar1 >> 0x1f & uVar1;
    if ((int)uVar5 < 1) break;
    uVar6 = uVar6 - 1;
    lVar3 = uVar5 - 1;
    uVar5 = uVar5 - 1;
    uVar7 = uVar6;
  } while (vLevel->pArray[lVar3] < Level);
  if ((-1 < (int)uVar7) && ((int)uVar7 <= vProd->nSize)) {
    Vec_IntPush(vProd,0);
    iVar4 = vProd->nSize + -1;
    if ((int)uVar7 < iVar4) {
      piVar2 = vProd->pArray;
      lVar3 = (long)vProd->nSize + -1;
      do {
        piVar2[lVar3] = piVar2[lVar3 + -1];
        lVar3 = lVar3 + -1;
      } while ((long)(ulong)uVar7 < lVar3);
      iVar4 = (int)lVar3;
    }
    vProd->pArray[iVar4] = Node;
    if ((int)uVar7 <= vLevel->nSize) {
      Vec_IntPush(vLevel,0);
      iVar4 = vLevel->nSize + -1;
      if ((int)uVar7 < iVar4) {
        piVar2 = vLevel->pArray;
        lVar3 = (long)vLevel->nSize + -1;
        do {
          piVar2[lVar3] = piVar2[lVar3 + -1];
          lVar3 = lVar3 + -1;
        } while ((long)(ulong)uVar7 < lVar3);
        iVar4 = (int)lVar3;
      }
      vLevel->pArray[iVar4] = Level;
      return;
    }
  }
  __assert_fail("iHere >= 0 && iHere <= p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x41e,"void Vec_IntInsert(Vec_Int_t *, int, int)");
}

Assistant:

void Wlc_IntInsert( Vec_Int_t * vProd, Vec_Int_t * vLevel, int Node, int Level )
{
    int i;
    for ( i = Vec_IntSize(vLevel) - 1; i >= 0; i-- )
        if ( Vec_IntEntry(vLevel, i) >= Level )
            break;
    Vec_IntInsert( vProd,  i + 1, Node  );
    Vec_IntInsert( vLevel, i + 1, Level );
}